

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O2

size_t utf8_ptr::to_wcharz(wchar_t *buf,size_t bufcnt,char *str,size_t len)

{
  size_t sVar1;
  
  if (bufcnt != 0) {
    sVar1 = to_wchar(buf,bufcnt - 1,str,len);
    buf[bufcnt - 1] = L'\0';
    return sVar1;
  }
  sVar1 = to_wchar(buf,0,str,len);
  return sVar1;
}

Assistant:

static size_t to_wcharz(wchar_t *buf, size_t bufcnt, const char *str,
                            size_t len)
    {
        /* we need at least one character for null termination */
        if (bufcnt > 0)
        {
            /* convert the string, reserving space for a null */
            size_t cnt = to_wchar(buf, bufcnt - 1, str, len);

            /* add the null termination */
            buf[bufcnt-1] = 0;

            /* return the character count */
            return cnt;
        }
        else
        {
            /* 
             *   the output buffer is zero length, so we can't convert
             *   anything and can't null terminate; just calculate the length
             */
            return to_wchar(buf, bufcnt, str, len);
        }
    }